

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O2

size_t __thiscall anon_unknown.dwarf_d5b84f::str_hash::operator()(str_hash *this,char *str)

{
  size_t sVar1;
  
  sVar1 = 0x1505;
  for (; (long)(char)*this != 0; this = this + 1) {
    sVar1 = sVar1 * 0x21 + (long)(char)*this;
  }
  return sVar1;
}

Assistant:

size_t operator()(const char* str) const
    {
        // djb2
        unsigned long hash = 5381;
        int c;

        while ((c = *str++) != 0)
            hash = ((hash << 5) + hash) + c;

        return hash;
    }